

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

int __thiscall agg::curve4_inc::init(curve4_inc *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double tmp2y;
  double tmp2x;
  double tmp1y;
  double tmp1x;
  double pre5;
  double pre4;
  double pre2;
  double pre1;
  double subdivide_step3;
  double subdivide_step2;
  double subdivide_step;
  double len;
  double dy3;
  double dx3;
  double dy2;
  double dx2;
  double dy1;
  double dx1;
  double y4_local;
  double x4_local;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve4_inc *this_local;
  
  *(double *)(this + 0x10) = in_XMM0_Qa;
  *(double *)(this + 0x18) = in_XMM1_Qa;
  *(double *)(this + 0x20) = in_XMM6_Qa;
  *(double *)(this + 0x28) = in_XMM7_Qa;
  dVar2 = sqrt((in_XMM2_Qa - in_XMM0_Qa) * (in_XMM2_Qa - in_XMM0_Qa) +
               (in_XMM3_Qa - in_XMM1_Qa) * (in_XMM3_Qa - in_XMM1_Qa));
  dVar3 = sqrt((in_XMM4_Qa - in_XMM2_Qa) * (in_XMM4_Qa - in_XMM2_Qa) +
               (in_XMM5_Qa - in_XMM3_Qa) * (in_XMM5_Qa - in_XMM3_Qa));
  dVar4 = sqrt((in_XMM6_Qa - in_XMM4_Qa) * (in_XMM6_Qa - in_XMM4_Qa) +
               (in_XMM7_Qa - in_XMM5_Qa) * (in_XMM7_Qa - in_XMM5_Qa));
  iVar1 = uround((dVar2 + dVar3 + dVar4) * 0.25 * *(double *)(this + 8));
  *(int *)this = iVar1;
  if (*(int *)this < 4) {
    *(undefined4 *)this = 4;
  }
  dVar2 = 1.0 / (double)*(int *)this;
  dVar3 = dVar2 * dVar2 * dVar2;
  dVar4 = dVar2 * dVar2 * 3.0;
  dVar5 = dVar2 * dVar2 * 6.0;
  dVar6 = dVar3 * 6.0;
  dVar7 = -in_XMM2_Qa + -in_XMM2_Qa + in_XMM0_Qa + in_XMM4_Qa;
  dVar8 = -in_XMM3_Qa + -in_XMM3_Qa + in_XMM1_Qa + in_XMM5_Qa;
  dVar9 = (in_XMM2_Qa - in_XMM4_Qa) * 3.0 + -in_XMM0_Qa + in_XMM6_Qa;
  dVar10 = (in_XMM3_Qa - in_XMM5_Qa) * 3.0 + -in_XMM1_Qa + in_XMM7_Qa;
  *(double *)(this + 0x30) = in_XMM0_Qa;
  *(double *)(this + 0x70) = in_XMM0_Qa;
  *(double *)(this + 0x38) = in_XMM1_Qa;
  *(double *)(this + 0x78) = in_XMM1_Qa;
  dVar11 = dVar9 * dVar3 + (in_XMM2_Qa - in_XMM0_Qa) * dVar2 * 3.0 + dVar7 * dVar4;
  *(double *)(this + 0x40) = dVar11;
  *(double *)(this + 0x80) = dVar11;
  dVar2 = dVar10 * dVar3 + (in_XMM3_Qa - in_XMM1_Qa) * dVar2 * 3.0 + dVar8 * dVar4;
  *(double *)(this + 0x48) = dVar2;
  *(double *)(this + 0x88) = dVar2;
  dVar2 = dVar7 * dVar5 + dVar9 * dVar6;
  *(double *)(this + 0x50) = dVar2;
  *(double *)(this + 0x90) = dVar2;
  dVar2 = dVar8 * dVar5 + dVar10 * dVar6;
  *(double *)(this + 0x58) = dVar2;
  *(double *)(this + 0x98) = dVar2;
  *(double *)(this + 0x60) = dVar9 * dVar6;
  *(double *)(this + 0x68) = dVar10 * dVar6;
  *(undefined4 *)(this + 4) = *(undefined4 *)this;
  return (int)this;
}

Assistant:

void curve4_inc::init(double x1, double y1, 
                          double x2, double y2, 
                          double x3, double y3,
                          double x4, double y4)
    {
        m_start_x = x1;
        m_start_y = y1;
        m_end_x   = x4;
        m_end_y   = y4;

        double dx1 = x2 - x1;
        double dy1 = y2 - y1;
        double dx2 = x3 - x2;
        double dy2 = y3 - y2;
        double dx3 = x4 - x3;
        double dy3 = y4 - y3;

        double len = (sqrt(dx1 * dx1 + dy1 * dy1) + 
                      sqrt(dx2 * dx2 + dy2 * dy2) + 
                      sqrt(dx3 * dx3 + dy3 * dy3)) * 0.25 * m_scale;

#if defined(_MSC_VER) && _MSC_VER <= 1200
        m_num_steps = uround(MSC60_fix_ICE(len));
#else
        m_num_steps = uround(len);
#endif

        if(m_num_steps < 4)
        {
            m_num_steps = 4;   
        }

        double subdivide_step  = 1.0 / m_num_steps;
        double subdivide_step2 = subdivide_step * subdivide_step;
        double subdivide_step3 = subdivide_step * subdivide_step * subdivide_step;

        double pre1 = 3.0 * subdivide_step;
        double pre2 = 3.0 * subdivide_step2;
        double pre4 = 6.0 * subdivide_step2;
        double pre5 = 6.0 * subdivide_step3;
	
        double tmp1x = x1 - x2 * 2.0 + x3;
        double tmp1y = y1 - y2 * 2.0 + y3;

        double tmp2x = (x2 - x3) * 3.0 - x1 + x4;
        double tmp2y = (y2 - y3) * 3.0 - y1 + y4;

        m_saved_fx = m_fx = x1;
        m_saved_fy = m_fy = y1;

        m_saved_dfx = m_dfx = (x2 - x1) * pre1 + tmp1x * pre2 + tmp2x * subdivide_step3;
        m_saved_dfy = m_dfy = (y2 - y1) * pre1 + tmp1y * pre2 + tmp2y * subdivide_step3;

        m_saved_ddfx = m_ddfx = tmp1x * pre4 + tmp2x * pre5;
        m_saved_ddfy = m_ddfy = tmp1y * pre4 + tmp2y * pre5;

        m_dddfx = tmp2x * pre5;
        m_dddfy = tmp2y * pre5;

        m_step = m_num_steps;
    }